

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

int l_hashfloat(lua_Number n)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint local_30;
  uint u;
  lua_Integer ni;
  double dStack_18;
  int i;
  lua_Number n_local;
  
  dStack_18 = n;
  dStack_18 = frexp(n,(int *)((long)&ni + 4));
  dStack_18 = dStack_18 * 2147483648.0;
  if ((dStack_18 < -9.223372036854776e+18) || (9.223372036854776e+18 <= dStack_18)) {
    if (!NAN(dStack_18)) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = dStack_18;
      auVar2._8_8_ = 0x7fffffffffffffff;
      auVar2._0_8_ = 0x7fffffffffffffff;
      auVar1 = vpand_avx(auVar1,auVar2);
      if ((auVar1._0_8_ != INFINITY) || (NAN(auVar1._0_8_))) {
        __assert_fail("(!(((n))==((n)))) || fabs(n) == ((lua_Number)(((__builtin_huge_val ()))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                      ,0x56,"int l_hashfloat(lua_Number)");
      }
    }
    n_local._4_4_ = 0;
  }
  else {
    local_30 = ni._4_4_ + (int)(long)dStack_18;
    if (0x7fffffff < local_30) {
      local_30 = local_30 ^ 0xffffffff;
    }
    n_local._4_4_ = local_30;
  }
  return n_local._4_4_;
}

Assistant:

static int l_hashfloat (lua_Number n) {
  int i;
  lua_Integer ni;
  n = l_mathop(frexp)(n, &i) * -cast_num(INT_MIN);
  if (!lua_numbertointeger(n, &ni)) {  /* is 'n' inf/-inf/NaN? */
    lua_assert(luai_numisnan(n) || l_mathop(fabs)(n) == cast_num(HUGE_VAL));
    return 0;
  }
  else {  /* normal case */
    unsigned int u = cast(unsigned int, i) + cast(unsigned int, ni);
    return cast_int(u <= cast(unsigned int, INT_MAX) ? u : ~u);
  }
}